

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall FDrawInfo::FloodLowerGap(FDrawInfo *this,seg_t *seg)

{
  double dVar1;
  double dVar2;
  line_t *plVar3;
  sector_t *psVar4;
  sector_t *sec;
  FDrawInfo *this_00;
  bool bVar5;
  float planez;
  sector_t bfake;
  sector_t ffake;
  wallseg local_508;
  sector_t local_4e8;
  sector_t local_280;
  
  psVar4 = gl_FakeFlat(seg->frontsector,&local_280,in_area,true);
  this_00 = (FDrawInfo *)seg->backsector;
  sec = gl_FakeFlat((sector_t *)this_00,&local_4e8,in_area,false);
  if ((sec->planes[0].Texture.texnum != skyflatnum.texnum) && (sec->planes[0].TexZ <= ViewPos.Z)) {
    dVar1 = (seg->v1->p).X;
    dVar2 = (seg->v1->p).Y;
    plVar3 = seg->linedef;
    bVar5 = seg->sidedef == plVar3->sidedef[0];
    local_508.z2 = (float)((dVar2 * (psVar4->floorplane).normal.Y +
                           dVar1 * (psVar4->floorplane).normal.X + (psVar4->floorplane).D) *
                          (psVar4->floorplane).negiC);
    local_508.y2 = (float)(*(double **)(plVar3->args + (ulong)bVar5 * 2 + -0xb))[1];
    planez = (float)(((sec->floorplane).normal.Y * dVar2 +
                     (sec->floorplane).normal.X * dVar1 + (sec->floorplane).D) *
                    (sec->floorplane).negiC);
    local_508.x2 = (float)**(double **)(plVar3->args + (ulong)bVar5 * 2 + -0xb);
    local_508.x1 = (float)**(double **)(plVar3->args + (ulong)!bVar5 * 2 + -0xb);
    local_508.y1 = (float)(*(double **)(plVar3->args + (ulong)!bVar5 * 2 + -0xb))[1];
    local_508.z1 = planez;
    SetupFloodStencil(this_00,&local_508);
    DrawFloodedPlane(this_00,&local_508,planez,sec,false);
    ClearFloodStencil(this_00,&local_508);
  }
  return;
}

Assistant:

void FDrawInfo::FloodLowerGap(seg_t * seg)
{
	wallseg ws;
	sector_t ffake, bfake;
	sector_t * fakefsector = gl_FakeFlat(seg->frontsector, &ffake, true);
	sector_t * fakebsector = gl_FakeFlat(seg->backsector, &bfake, false);

	vertex_t * v1, * v2;

	// Although the plane can be sloped this code will only be called
	// when the edge itself is not.
	double backz = fakebsector->floorplane.ZatPoint(seg->v1);
	double frontz = fakefsector->floorplane.ZatPoint(seg->v1);


	if (fakebsector->GetTexture(sector_t::floor) == skyflatnum) return;
	if (fakebsector->GetPlaneTexZ(sector_t::floor) > ViewPos.Z) return;

	if (seg->sidedef == seg->linedef->sidedef[0])
	{
		v1=seg->linedef->v1;
		v2=seg->linedef->v2;
	}
	else
	{
		v1=seg->linedef->v2;
		v2=seg->linedef->v1;
	}

	ws.x1 = v1->fX();
	ws.y1 = v1->fY();
	ws.x2 = v2->fX();
	ws.y2 = v2->fY();

	ws.z2= frontz;
	ws.z1= backz;

	// Step1: Draw a stencil into the gap
	SetupFloodStencil(&ws);

	// Step2: Project the ceiling plane into the gap
	DrawFloodedPlane(&ws, ws.z1, fakebsector, false);

	// Step3: Delete the stencil
	ClearFloodStencil(&ws);
}